

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void start_pass_huff(j_compress_ptr cinfo,boolean gather_statistics)

{
  int iVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  jpeg_component_info *compptr;
  int actbl;
  int dctbl;
  int ci;
  huff_entropy_ptr entropy;
  c_derived_tbl **in_stack_00000510;
  int in_stack_00000518;
  boolean in_stack_0000051c;
  j_compress_ptr in_stack_00000520;
  int local_1c;
  
  lVar2 = in_RDI[0x3e];
  if (in_ESI == 0) {
    *(code **)(lVar2 + 8) = encode_mcu_huff;
    *(code **)(lVar2 + 0x10) = finish_pass_huff;
  }
  else {
    *(code **)(lVar2 + 8) = encode_mcu_gather;
    *(code **)(lVar2 + 0x10) = finish_pass_gather;
  }
  iVar3 = jsimd_can_huff_encode_one_block();
  *(int *)(lVar2 + 0xc0) = iVar3;
  for (local_1c = 0; local_1c < *(int *)((long)in_RDI + 0x144); local_1c = local_1c + 1) {
    iVar3 = *(int *)(in_RDI[(long)local_1c + 0x29] + 0x14);
    iVar1 = *(int *)(in_RDI[(long)local_1c + 0x29] + 0x18);
    if (in_ESI == 0) {
      jpeg_make_c_derived_tbl
                (in_stack_00000520,in_stack_0000051c,in_stack_00000518,in_stack_00000510);
      jpeg_make_c_derived_tbl
                (in_stack_00000520,in_stack_0000051c,in_stack_00000518,in_stack_00000510);
    }
    else {
      if ((iVar3 < 0) || (3 < iVar3)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x32;
        *(int *)(*in_RDI + 0x2c) = iVar3;
        (**(code **)*in_RDI)(in_RDI);
      }
      if ((iVar1 < 0) || (3 < iVar1)) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x32;
        *(int *)(*in_RDI + 0x2c) = iVar1;
        (**(code **)*in_RDI)(in_RDI);
      }
      if (*(long *)(lVar2 + 0x80 + (long)iVar3 * 8) == 0) {
        uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x808);
        *(undefined8 *)(lVar2 + 0x80 + (long)iVar3 * 8) = uVar4;
      }
      memset(*(void **)(lVar2 + 0x80 + (long)iVar3 * 8),0,0x808);
      if (*(long *)(lVar2 + 0xa0 + (long)iVar1 * 8) == 0) {
        uVar4 = (**(code **)in_RDI[1])(in_RDI,1,0x808);
        *(undefined8 *)(lVar2 + 0xa0 + (long)iVar1 * 8) = uVar4;
      }
      memset(*(void **)(lVar2 + 0xa0 + (long)iVar1 * 8),0,0x808);
    }
    *(undefined4 *)(lVar2 + 0x24 + (long)local_1c * 4) = 0;
  }
  if (*(int *)(lVar2 + 0xc0) == 0) {
    *(undefined8 *)(lVar2 + 0x18) = 0;
    *(undefined4 *)(lVar2 + 0x20) = 0x40;
  }
  else {
    *(undefined8 *)(lVar2 + 0x18) = 0;
    *(undefined4 *)(lVar2 + 0x20) = 0x40;
  }
  *(int *)(lVar2 + 0x38) = (int)in_RDI[0x23];
  *(undefined4 *)(lVar2 + 0x3c) = 0;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff(j_compress_ptr cinfo, boolean gather_statistics)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, dctbl, actbl;
  jpeg_component_info *compptr;

  if (gather_statistics) {
#ifdef ENTROPY_OPT_SUPPORTED
    entropy->pub.encode_mcu = encode_mcu_gather;
    entropy->pub.finish_pass = finish_pass_gather;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    entropy->pub.encode_mcu = encode_mcu_huff;
    entropy->pub.finish_pass = finish_pass_huff;
  }

  entropy->simd = jsimd_can_huff_encode_one_block();

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    if (gather_statistics) {
#ifdef ENTROPY_OPT_SUPPORTED
      /* Check for invalid table indexes */
      /* (make_c_derived_tbl does this in the other path) */
      if (dctbl < 0 || dctbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, dctbl);
      if (actbl < 0 || actbl >= NUM_HUFF_TBLS)
        ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, actbl);
      /* Allocate and zero the statistics tables */
      /* Note that jpeg_gen_optimal_table expects 257 entries in each table! */
      if (entropy->dc_count_ptrs[dctbl] == NULL)
        entropy->dc_count_ptrs[dctbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->dc_count_ptrs[dctbl], 257 * sizeof(long));
      if (entropy->ac_count_ptrs[actbl] == NULL)
        entropy->ac_count_ptrs[actbl] = (long *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      257 * sizeof(long));
      MEMZERO(entropy->ac_count_ptrs[actbl], 257 * sizeof(long));
#endif
    } else {
      /* Compute derived values for Huffman tables */
      /* We may do this more than once for a table, but it's not expensive */
      jpeg_make_c_derived_tbl(cinfo, TRUE, dctbl,
                              &entropy->dc_derived_tbls[dctbl]);
      jpeg_make_c_derived_tbl(cinfo, FALSE, actbl,
                              &entropy->ac_derived_tbls[actbl]);
    }
    /* Initialize DC predictions to 0 */
    entropy->saved.last_dc_val[ci] = 0;
  }

  /* Initialize bit buffer to empty */
  if (entropy->simd) {
    entropy->saved.put_buffer.simd = 0;
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    entropy->saved.free_bits = 0;
#else
    entropy->saved.free_bits = SIMD_BIT_BUF_SIZE;
#endif
  } else {
    entropy->saved.put_buffer.c = 0;
    entropy->saved.free_bits = BIT_BUF_SIZE;
  }

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}